

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DGParameters.h
# Opt level: O3

void __thiscall
dg::DGParameters<dg::LLVMNode>::DGParameters(DGParameters<dg::LLVMNode> *this,LLVMNode *cs)

{
  _Rb_tree_header *p_Var1;
  BBlock<dg::LLVMNode> *pBVar2;
  
  p_Var1 = &(this->globals)._M_t._M_impl.super__Rb_tree_header;
  (this->globals)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->globals)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->globals)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->globals)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->globals)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->params)._M_t._M_impl.super__Rb_tree_header;
  (this->params)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->params)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->params)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->params)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->params)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->vararg)._M_t.
  super___uniq_ptr_impl<dg::DGParameterPair<dg::LLVMNode>,_std::default_delete<dg::DGParameterPair<dg::LLVMNode>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_dg::DGParameterPair<dg::LLVMNode>_*,_std::default_delete<dg::DGParameterPair<dg::LLVMNode>_>_>
  .super__Head_base<0UL,_dg::DGParameterPair<dg::LLVMNode>_*,_false>._M_head_impl =
       (DGParameterPair<dg::LLVMNode> *)0x0;
  (this->noret)._M_t.super___uniq_ptr_impl<dg::LLVMNode,_std::default_delete<dg::LLVMNode>_>._M_t.
  super__Tuple_impl<0UL,_dg::LLVMNode_*,_std::default_delete<dg::LLVMNode>_>.
  super__Head_base<0UL,_dg::LLVMNode_*,_false>._M_head_impl = (LLVMNode *)0x0;
  pBVar2 = (BBlock<dg::LLVMNode> *)operator_new(0x208);
  BBlock<dg::LLVMNode>::BBlock(pBVar2,(LLVMNode *)0x0,(DependenceGraphT *)0x0);
  this->BBIn = pBVar2;
  pBVar2 = (BBlock<dg::LLVMNode> *)operator_new(0x208);
  BBlock<dg::LLVMNode>::BBlock(pBVar2,(LLVMNode *)0x0,(DependenceGraphT *)0x0);
  this->BBOut = pBVar2;
  this->callSite = cs;
  return;
}

Assistant:

DGParameters<NodeT>(NodeT *cs = nullptr)
            : BBIn(new BBlock<NodeT>), BBOut(new BBlock<NodeT>), callSite(cs) {}